

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScrollableWindow.cpp
# Opt level: O1

void __thiscall cursespp::ScrollableWindow::OnAdapterChanged(ScrollableWindow *this)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong *puVar5;
  undefined4 extraout_var_01;
  ulong uVar6;
  long *plVar4;
  undefined4 extraout_var_00;
  
  iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x42])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x19])(this);
  iVar3 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x18])(this);
  (**(code **)(*plVar4 + 0x10))(plVar4,(long)iVar2,(long)iVar3);
  iVar2 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x43])(this);
  puVar5 = (ulong *)CONCAT44(extraout_var_00,iVar2);
  uVar6 = 0;
  if (puVar5[3] != 0) {
    uVar6 = puVar5[3] - 1;
  }
  pp_Var1 = (this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable;
  if ((*puVar5 <= uVar6) && (uVar6 <= *puVar5 + puVar5[1])) {
    (*pp_Var1[0x3a])(this);
    return;
  }
  iVar2 = (*pp_Var1[0x43])(this);
  (**(code **)(*plVar4 + 0x28))
            (plVar4,this,*(undefined8 *)CONCAT44(extraout_var_01,iVar2),
             (undefined8 *)CONCAT44(extraout_var_01,iVar2));
  (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[4])(this);
  return;
}

Assistant:

void ScrollableWindow::OnAdapterChanged() {
    IScrollAdapter *adapter = &GetScrollAdapter();

    adapter->SetDisplaySize(GetContentWidth(), GetContentHeight());

    if (IsLastItemVisible()) {
        this->ScrollToBottom();
    }
    else {
        ScrollPos &pos = this->GetMutableScrollPosition();
        adapter->DrawPage(this, pos.firstVisibleEntryIndex, pos);
        this->Invalidate();
    }
}